

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,EndpointDeclaration *e)

{
  EndpointDetails *pEVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  size_t sVar3;
  ChildEndpointPath *pCVar4;
  long lVar5;
  PathSection *p;
  PathSection *pPVar6;
  
  pEVar1 = (e->details).object;
  if (pEVar1 != (EndpointDetails *)0x0) {
    ppVar2 = (pEVar1->dataTypes).items;
    sVar3 = (pEVar1->dataTypes).numActive;
    for (lVar5 = 0; sVar3 << 3 != lVar5; lVar5 = lVar5 + 8) {
      (*this->_vptr_ASTVisitor[3])(this,*(undefined8 *)((long)&ppVar2->object + lVar5));
    }
    visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&pEVar1->arraySize);
  }
  if ((e->childPath).object != (ChildEndpointPath *)0x0) {
    pCVar4 = pool_ptr<soul::AST::ChildEndpointPath>::operator->(&e->childPath);
    pPVar6 = (pCVar4->sections).items;
    for (lVar5 = (pCVar4->sections).numActive << 4; lVar5 != 0; lVar5 = lVar5 + -0x10) {
      visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&pPVar6->index);
      pPVar6 = pPVar6 + 1;
    }
  }
  (*this->_vptr_ASTVisitor[0xb])(this,&e->annotation);
  return;
}

Assistant:

virtual void visit (AST::EndpointDeclaration& e)
    {
        if (auto details = e.details.get())
        {
            for (auto& type : details->dataTypes)
                visitObject (type);

            visitObjectIfNotNull (details->arraySize);
        }

        if (e.childPath != nullptr)
            for (auto& p : e.childPath->sections)
                visitObjectIfNotNull (p.index);

        visit (e.annotation);
    }